

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManRandomInfo(Vec_Ptr_t *vInfo,int iInputStart,int iWordStart,int iWordStop)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  iVar3 = vInfo->nSize;
  if (iInputStart < iVar3) {
    uVar5 = (ulong)(uint)iInputStart;
    uVar2 = Gia_ManRandom::m_w;
    uVar4 = Gia_ManRandom::m_z;
    do {
      if (iInputStart < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (iWordStart < iWordStop) {
        pvVar1 = vInfo->pArray[uVar5];
        lVar6 = (long)iWordStart;
        do {
          uVar4 = (uVar4 >> 0x10) + (uVar4 & 0xffff) * 0x9069;
          uVar2 = (uVar2 >> 0x10) + (uVar2 & 0xffff) * 18000;
          *(uint *)((long)pvVar1 + lVar6 * 4) = uVar4 * 0x10000 + uVar2;
          lVar6 = lVar6 + 1;
        } while (iWordStop != lVar6);
        iVar3 = vInfo->nSize;
        Gia_ManRandom::m_z = uVar4;
        Gia_ManRandom::m_w = uVar2;
      }
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < iVar3);
  }
  return;
}

Assistant:

void Gia_ManRandomInfo( Vec_Ptr_t * vInfo, int iInputStart, int iWordStart, int iWordStop )
{
    unsigned * pInfo;
    int i, w;
    Vec_PtrForEachEntryStart( unsigned *, vInfo, pInfo, i, iInputStart )
        for ( w = iWordStart; w < iWordStop; w++ )
            pInfo[w] = Gia_ManRandom(0);
}